

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O1

void __thiscall
OpenMPAlignedClause::generateDOT
          (OpenMPAlignedClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_t sVar10;
  uint uVar11;
  ulong *puVar12;
  long *plVar13;
  size_type *psVar14;
  ulong uVar15;
  pointer ppcVar16;
  undefined8 uVar17;
  uint uVar18;
  uint uVar19;
  string __str_1;
  string __str;
  string __str_3;
  string alignment;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string clause_kind;
  string current_line;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  ofstream *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  OpenMPAlignedClause *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_168 = dot_file;
  local_58 = this;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)depth);
  uVar19 = -depth;
  if (0 < depth) {
    uVar19 = depth;
  }
  uVar18 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_0016ce19;
      }
      if (uVar11 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_0016ce19;
      }
      if (uVar11 < 10000) goto LAB_0016ce19;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar11);
    uVar18 = uVar18 + 1;
  }
LAB_0016ce19:
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)uVar18 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_1c8),uVar18,uVar19);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x1a884c);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_178 = *puVar12;
    lStack_170 = plVar8[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *puVar12;
    local_188 = (ulong *)*plVar8;
  }
  local_180 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_160 = &local_150;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_150 = *puVar12;
    lStack_148 = plVar8[3];
  }
  else {
    local_150 = *puVar12;
    local_160 = (ulong *)*plVar8;
  }
  local_158 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar19 = -index;
  if (0 < index) {
    uVar19 = index;
  }
  uVar18 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_0016cf70;
      }
      if (uVar11 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_0016cf70;
      }
      if (uVar11 < 10000) goto LAB_0016cf70;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar11);
    uVar18 = uVar18 + 1;
  }
LAB_0016cf70:
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar18 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1e8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar18,uVar19);
  uVar15 = 0xf;
  if (local_160 != &local_150) {
    uVar15 = local_150;
  }
  paVar1 = &local_1e8.field_2;
  if (uVar15 < local_1e8._M_string_length + local_158) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      uVar17 = local_1e8.field_2._M_allocated_capacity;
    }
    if (local_1e8._M_string_length + local_158 <= (ulong)uVar17) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_160);
      goto LAB_0016d010;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1e8._M_dataplus._M_p);
LAB_0016d010:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar14 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_98.field_2._M_allocated_capacity = *psVar14;
    local_98.field_2._8_8_ = puVar9[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar14;
    local_98._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_98._M_string_length = puVar9[1];
  *puVar9 = psVar14;
  puVar9[1] = 0;
  *(undefined1 *)psVar14 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  std::operator+(&local_1e8,&local_50,parent_node);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1b8 = *plVar13;
    lStack_1b0 = plVar8[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar13;
    local_1c8 = (long *)*plVar8;
  }
  local_1c0 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1c8,(ulong)local_98._M_dataplus._M_p);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_178 = *puVar12;
    lStack_170 = plVar8[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *puVar12;
    local_188 = (ulong *)*plVar8;
  }
  local_180 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_188);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_150 = *puVar12;
    lStack_148 = plVar8[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar12;
    local_160 = (ulong *)*plVar8;
  }
  local_158 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = local_78;
  if (local_78 == (char *)0x0) {
    std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
  }
  else {
    sVar10 = strlen(local_78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar5,sVar10);
  }
  std::__cxx11::string::append((char *)&local_50);
  uVar19 = 0;
  local_158 = 0;
  local_150 = local_150 & 0xffffffffffffff00;
  local_180 = 0;
  local_178 = local_178 & 0xffffffffffffff00;
  ppcVar16 = (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_188 = &local_178;
  local_160 = &local_150;
  if (ppcVar16 !=
      (local_58->super_OpenMPClause).expressions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      std::__cxx11::string::append((char *)&local_1e8);
      uVar18 = 1;
      if (9 < uVar19) {
        uVar6 = 4;
        uVar11 = uVar19;
        do {
          uVar18 = uVar6;
          if (uVar11 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_0016d37c;
          }
          if (uVar11 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_0016d37c;
          }
          if (uVar11 < 10000) goto LAB_0016d37c;
          bVar4 = 99999 < uVar11;
          uVar6 = uVar18 + 4;
          uVar11 = uVar11 / 10000;
        } while (bVar4);
        uVar18 = uVar18 + 1;
      }
LAB_0016d37c:
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar18);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8,uVar18,uVar19);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        uVar17 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_1a0 + local_1e8._M_string_length) {
        uVar15 = 0xf;
        if (local_1a8 != &local_198) {
          uVar15 = local_198;
        }
        if (uVar15 < local_1a0 + local_1e8._M_string_length) goto LAB_0016d3e9;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p);
      }
      else {
LAB_0016d3e9:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_1a8);
      }
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_1b8 = *plVar8;
        lStack_1b0 = puVar9[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *plVar8;
        local_1c8 = (long *)*puVar9;
      }
      local_1c0 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)plVar8 = 0;
      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1c8);
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_140,&local_50,&local_98);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar12 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar12) {
        local_198 = *puVar12;
        lStack_190 = plVar8[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar12;
        local_1a8 = (ulong *)*plVar8;
      }
      local_1a0 = plVar8[1];
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_188);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      psVar14 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_1e8.field_2._M_allocated_capacity = *psVar14;
        local_1e8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar14;
        local_1e8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1e8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_1b8 = *plVar8;
        lStack_1b0 = puVar9[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *plVar8;
        local_1c8 = (long *)*puVar9;
      }
      local_1c0 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_1c8);
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = local_78;
      if (local_78 == (char *)0x0) {
        std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
      }
      else {
        sVar10 = strlen(local_78);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar5,sVar10);
      }
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      std::__cxx11::string::append((char *)&local_b8);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_188);
      local_d8 = &local_c8;
      plVar13 = plVar8 + 2;
      if ((long *)*plVar8 == plVar13) {
        local_c8 = *plVar13;
        lStack_c0 = plVar8[3];
      }
      else {
        local_c8 = *plVar13;
        local_d8 = (long *)*plVar8;
      }
      local_d0 = plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar14 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_118.field_2._M_allocated_capacity = *psVar14;
        local_118.field_2._8_8_ = plVar8[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar14;
        local_118._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_118._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_188);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar14 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140.field_2._8_8_ = plVar8[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_140._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar12 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar12) {
        local_198 = *puVar12;
        lStack_190 = plVar8[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar12;
        local_1a8 = (ulong *)*plVar8;
      }
      local_1a0 = plVar8[1];
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,*ppcVar16,&local_119);
      uVar15 = 0xf;
      if (local_1a8 != &local_198) {
        uVar15 = local_198;
      }
      if (uVar15 < (ulong)(local_f0 + local_1a0)) {
        uVar15 = 0xf;
        if (local_f8 != local_e8) {
          uVar15 = local_e8[0];
        }
        if (uVar15 < (ulong)(local_f0 + local_1a0)) goto LAB_0016d8c7;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_1a8);
      }
      else {
LAB_0016d8c7:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_f8);
      }
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      puVar12 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_1e8.field_2._M_allocated_capacity = *puVar12;
        local_1e8.field_2._8_8_ = puVar9[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *puVar12;
        local_1e8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_1e8._M_string_length = puVar9[1];
      *puVar9 = puVar12;
      puVar9[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      plVar13 = plVar8 + 2;
      if ((long *)*plVar8 == plVar13) {
        local_1b8 = *plVar13;
        lStack_1b0 = plVar8[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *plVar13;
        local_1c8 = (long *)*plVar8;
      }
      local_1c0 = plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_1c8);
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      pcVar5 = local_78;
      if (local_78 == (char *)0x0) {
        std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
      }
      else {
        sVar10 = strlen(local_78);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar5,sVar10);
      }
      uVar19 = uVar19 + 1;
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 !=
             (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  pcVar3 = (local_58->user_defined_alignment)._M_dataplus._M_p;
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,pcVar3,
             pcVar3 + (local_58->user_defined_alignment)._M_string_length);
  iVar7 = std::__cxx11::string::compare((char *)&local_188);
  if (iVar7 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_160);
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::append((char *)&local_1c8);
    std::operator+(&local_118,&local_50,&local_98);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    paVar1 = &local_140.field_2;
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_1c8);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar12) {
      local_198 = *puVar12;
      lStack_190 = plVar8[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar12;
      local_1a8 = (ulong *)*plVar8;
    }
    local_1a0 = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1e8.field_2._M_allocated_capacity = *psVar14;
      local_1e8.field_2._8_8_ = plVar8[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar14;
      local_1e8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1e8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_118.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_78;
    if (local_78 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar10 = strlen(local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar5,sVar10);
    }
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_1c8);
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_a8 = *plVar13;
      lStack_a0 = plVar8[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar13;
      local_b8 = (long *)*plVar8;
    }
    local_b0 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_d8 = &local_c8;
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_c8 = *plVar13;
      lStack_c0 = plVar8[3];
    }
    else {
      local_c8 = *plVar13;
      local_d8 = (long *)*plVar8;
    }
    local_d0 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_1c8);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_118.field_2._M_allocated_capacity = *psVar14;
      local_118.field_2._8_8_ = plVar8[3];
      local_118._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar14;
      local_118._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_118._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_160);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar12) {
      local_198 = *puVar12;
      lStack_190 = plVar8[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar12;
      local_1a8 = (ulong *)*plVar8;
    }
    local_1a0 = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    puVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_1e8.field_2._M_allocated_capacity = *puVar12;
      local_1e8.field_2._8_8_ = puVar9[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar12;
      local_1e8._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_1e8._M_string_length = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8,local_e8[0] + 1);
    }
    pcVar5 = local_78;
    if (local_78 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar10 = strlen(local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar5,sVar10);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return;
}

Assistant:

void OpenMPAlignedClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "aligned_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    std::string parameter_string;

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };
    std::string alignment = this->getUserDefinedAlignment();
    if (alignment != "") {
        parameter_string = alignment;
        std::string alignment_name = clause_kind + "_aligned_alignment";
        current_line = indent + clause_kind + " -- " + alignment_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + alignment_name + " [label = \"" + alignment_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };    

}